

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void push_Ib(PDISASM pMyDisasm)

{
  UIntPtr UVar1;
  ulong uVar2;
  
  (pMyDisasm->Instruction).Category = 0x10001;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"push",5);
  UVar1 = (pMyDisasm->Reserved_).EIP_;
  uVar2 = (pMyDisasm->Reserved_).EndOfBlock;
  if (uVar2 < UVar1 + 2 && uVar2 != 0) {
    (pMyDisasm->Reserved_).OutOfBlock = 1;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
  }
  else {
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand2).OpMnemonic,"%.8X",(long)*(char *)(UVar1 + 1)
                       );
    (pMyDisasm->Reserved_).ImmediatSize = 8;
    UVar1 = (pMyDisasm->Reserved_).EIP_;
    (pMyDisasm->Instruction).Immediat = (ulong)*(byte *)(UVar1 + 1);
    (pMyDisasm->Reserved_).EIP_ = UVar1 + 2;
    (pMyDisasm->Operand1).OpType = 0x30000;
    (pMyDisasm->Operand1).OpSize = 0x20;
    (pMyDisasm->Operand1).Memory.BaseRegister = 0x10;
    (pMyDisasm->Operand2).OpType = 0x8040000;
    (pMyDisasm->Operand2).OpSize = 8;
    (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 1;
    (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 0x10;
  }
  return;
}

Assistant:

void __bea_callspec__ push_Ib(PDISASM pMyDisasm)
{
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+DATA_TRANSFER;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "push");
    #endif
    if (!Security(2, pMyDisasm)) return;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand2.OpMnemonic,"%.8X",(Int64)*((Int8*) (GV.EIP_+1)));
    #endif
    GV.ImmediatSize = 8;
    pMyDisasm->Instruction.Immediat = *((UInt8*) (GV.EIP_+1));
    GV.EIP_ += 2;
    pMyDisasm->Operand1.OpType = MEMORY_TYPE;
    pMyDisasm->Operand1.OpSize = 32;
    pMyDisasm->Operand1.Memory.BaseRegister = REG4;
    pMyDisasm->Operand2.OpType = CONSTANT_TYPE+ABSOLUTE_;
    pMyDisasm->Operand2.OpSize = 8;
    pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
    pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG4;

}